

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::Interpreter::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,EnergyReport *aReport)

{
  ChannelMask *aChannelMask;
  ByteArray *aBytes;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  Interpreter *local_18;
  EnergyReport *aReport_local;
  string *ret;
  
  local_19 = 0;
  local_18 = this;
  aReport_local = (EnergyReport *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  ToString_abi_cxx11_(&local_60,local_18,aChannelMask);
  std::operator+(&local_40,&local_60,"\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  utils::Hex_abi_cxx11_(&local_b0,(utils *)&(local_18->mContext).mDomAliases,aBytes);
  std::operator+(&local_90,"energyList=",&local_b0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::ToString(const EnergyReport &aReport)
{
    std::string ret;
    ret += ToString(aReport.mChannelMask) + "\n";
    ret += "energyList=" + utils::Hex(aReport.mEnergyList);
    return ret;
}